

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

void deqp::gls::anon_unknown_1::bindAttributes
               (TestLog *log,Functions *gl,deUint32 program,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *binds)

{
  ostringstream *this;
  GLenum err;
  pointer pBVar1;
  MessageBuilder local_1b0;
  
  this = &local_1b0.m_str;
  for (pBVar1 = (binds->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pBVar1 != (binds->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_finish; pBVar1 = pBVar1 + 1) {
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"Bind attribute: \'");
    std::operator<<((ostream *)this,(string *)pBVar1);
    std::operator<<((ostream *)this,"\' to ");
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    (*gl->bindAttribLocation)(program,pBVar1->m_location,(pBVar1->m_attribute)._M_dataplus._M_p);
    err = (*gl->getError)();
    glu::checkError(err,"glBindAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x1df);
  }
  return;
}

Assistant:

void bindAttributes (TestLog& log, const glw::Functions& gl, deUint32 program, const vector<Bind>& binds)
{
	for (vector<Bind>::const_iterator iter = binds.begin(); iter != binds.end(); ++iter)
	{
		log << TestLog::Message << "Bind attribute: '" << iter->getAttributeName() << "' to " << iter->getLocation() << TestLog::EndMessage;
		gl.bindAttribLocation(program, iter->getLocation(), iter->getAttributeName().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindAttribLocation()");
	}
}